

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::NativeColorMappingCase::executeForConfig
          (NativeColorMappingCase *this,EGLDisplay display,EGLConfig config)

{
  NativeType NVar1;
  EglTestContext *this_00;
  bool bVar2;
  Capability CVar3;
  Capability CVar4;
  int iVar5;
  TestLog *pTVar6;
  char *pcVar7;
  NativeDisplayFactory *pNVar8;
  CommandLine *pCVar9;
  NativeWindowFactory *this_01;
  NotSupportedError *pNVar10;
  NativePixmapFactory *this_02;
  EGLContext pvVar11;
  NativeWindow *nativeWindow_00;
  NativeDisplay *pNVar12;
  undefined8 uVar13;
  NativePixmap *pNVar14;
  DefaultDeleter<eglu::NativePixmap> local_1cb1;
  undefined1 local_1cb0 [8];
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> nativePixmap_1;
  undefined1 local_1c98 [8];
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> nativePixmap;
  undefined1 local_1c78 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> nativeWindow;
  undefined1 local_1c60 [8];
  Functions gl;
  UniqueContext context;
  NotSupportedError *anon_var_0_1;
  NotSupportedError *anon_var_0;
  NativePixmapFactory *pixmapFactory;
  NativeWindowFactory *windowFactory;
  int waitFrames;
  string local_1d8;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  ScopedLogSection local_160;
  ScopedLogSection logSection;
  undefined1 local_150 [8];
  string configIdStr;
  Library *egl;
  Vec4 colors [16];
  int height;
  int width;
  EGLConfig config_local;
  EGLDisplay display_local;
  NativeColorMappingCase *this_local;
  
  colors[0xf].m_data[3] = 1.79366e-43;
  colors[0xf].m_data[2] = 1.79366e-43;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&egl,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0].m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[1].m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[2].m_data + 2),0.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[3].m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[4].m_data + 2),1.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[5].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[6].m_data + 2),1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[7].m_data + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[8].m_data + 2),0.0,0.0,0.5,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[9].m_data + 2),0.0,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[10].m_data + 2),0.0,0.5,0.5,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0xb].m_data + 2),0.5,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0xc].m_data + 2),0.5,0.0,0.5,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0xd].m_data + 2),0.5,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0xe].m_data + 2),0.5,0.5,0.5,1.0);
  configIdStr.field_2._8_8_ =
       EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  logSection.m_log._4_4_ =
       eglu::getConfigAttribInt((Library *)configIdStr.field_2._8_8_,display,config,0x3028);
  de::toString<int>((string *)local_150,(int *)((long)&logSection.m_log + 4));
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::operator+(&local_1b0,"Config ID ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,pcVar7,&local_1b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&waitFrames,
                 "Config ID ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,pcVar7,(allocator<char> *)((long)&windowFactory + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_160,pTVar6,&local_190,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&windowFactory + 7));
  std::__cxx11::string::~string((string *)&waitFrames);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_1b0);
  windowFactory._0_4_ = 5;
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  logConfigInfo(pTVar6,(Library *)configIdStr.field_2._8_8_,display,config,this->m_nativeType,5);
  pNVar8 = EglTestContext::getNativeDisplayFactory
                     ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pCVar9 = tcu::TestContext::getCommandLine
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  this_01 = eglu::selectNativeWindowFactory(pNVar8,pCVar9);
  CVar3 = eglu::NativeWindowFactory::getCapabilities(this_01);
  if ((CVar3 & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"Native window doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1e8);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pNVar8 = EglTestContext::getNativeDisplayFactory
                     ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pCVar9 = tcu::TestContext::getCommandLine
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  this_02 = eglu::selectNativePixmapFactory(pNVar8,pCVar9);
  if (this->m_nativeType == NATIVETYPE_PIXMAP) {
    CVar4 = eglu::NativePixmapFactory::getCapabilities(this_02);
    if ((CVar4 & CAPABILITY_READ_PIXELS) == 0) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar10,"Native pixmap doesn\'t support readPixels()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                 ,0x1f9);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else if ((this->m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) &&
          ((CVar4 = eglu::NativePixmapFactory::getCapabilities(this_02),
           (CVar4 & CAPABILITY_READ_PIXELS) == 0 ||
           (CVar4 = eglu::NativePixmapFactory::getCapabilities(this_02),
           (CVar4 & CAPABILITY_CREATE_SURFACE_LEGACY) == 0)))) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"Native pixmap doesn\'t support readPixels() or legacy create surface",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
               ,0x1ff);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  uVar13 = configIdStr.field_2._8_8_;
  pvVar11 = createGLES2Context((Library *)configIdStr.field_2._8_8_,display,config);
  eglu::UniqueContext::UniqueContext
            ((UniqueContext *)&gl.waitSync,(Library *)uVar13,display,pvVar11);
  glw::Functions::Functions((Functions *)local_1c60);
  this_00 = (this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx;
  nativeWindow.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
  _12_4_ = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions
            (this_00,(Functions *)local_1c60,
             (ApiType)nativeWindow.
                      super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                      m_data._12_4_);
  NVar1 = this->m_nativeType;
  if (NVar1 == NATIVETYPE_WINDOW) {
    pNVar12 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    eglu::WindowParams::WindowParams
              ((WindowParams *)
               &nativePixmap.
                super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data
                .field_0xc,0x80,0x80,VISIBILITY_VISIBLE);
    iVar5 = (*(this_01->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (this_01,pNVar12,display,config,0,
                       &nativePixmap.
                        super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>
                        .m_data.field_0xc);
    de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
              ((DefaultDeleter<eglu::NativeWindow> *)
               &nativePixmap.
                super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data
                .field_0xb);
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1c78,
               iVar5);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    pNVar12 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    nativeWindow_00 =
         de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
         operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                   local_1c78);
    pvVar11 = eglu::UniqueContext::operator*((UniqueContext *)&gl.waitSync);
    bVar2 = testNativeWindow(pTVar6,pNVar12,nativeWindow_00,display,pvVar11,config,
                             (Functions *)local_1c60,(bool)(this->m_render & 1),5,0x10,(Vec4 *)&egl)
    ;
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1c78)
    ;
  }
  else if (NVar1 == NATIVETYPE_PIXMAP) {
    pNVar12 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    uVar13 = (**(code **)(*(long *)this_02 + 0x20))(this_02,pNVar12,display,config,0,0x80,0x80);
    de::DefaultDeleter<eglu::NativePixmap>::DefaultDeleter
              ((DefaultDeleter<eglu::NativePixmap> *)
               &nativePixmap_1.
                super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data
                .field_0xf);
    de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::UniquePtr
              ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1c98,
               uVar13);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    pNVar12 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    pNVar14 = de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
              operator*((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                        local_1c98);
    pvVar11 = eglu::UniqueContext::operator*((UniqueContext *)&gl.waitSync);
    bVar2 = testNativePixmap(pTVar6,pNVar12,pNVar14,display,pvVar11,config,(Functions *)local_1c60,
                             (bool)(this->m_render & 1),0x10,(Vec4 *)&egl);
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
    de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::~UniquePtr
              ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1c98)
    ;
  }
  else if (NVar1 == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    pNVar12 = EglTestContext::getNativeDisplay
                        ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
    uVar13 = (**(code **)(*(long *)this_02 + 0x20))(this_02,pNVar12,display,config,0,0x80,0x80);
    de::DefaultDeleter<eglu::NativePixmap>::DefaultDeleter(&local_1cb1);
    de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::UniquePtr
              ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1cb0,
               uVar13);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    uVar13 = configIdStr.field_2._8_8_;
    pNVar14 = de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
              operator*((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                        local_1cb0);
    pvVar11 = eglu::UniqueContext::operator*((UniqueContext *)&gl.waitSync);
    bVar2 = testNativePixmapCopy
                      (pTVar6,(Library *)uVar13,pNVar14,display,pvVar11,config,
                       (Functions *)local_1c60,(bool)(this->m_render & 1),0x10,(Vec4 *)&egl);
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
    de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::~UniquePtr
              ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1cb0)
    ;
  }
  eglu::UniqueContext::~UniqueContext((UniqueContext *)&gl.waitSync);
  tcu::ScopedLogSection::~ScopedLogSection(&local_160);
  std::__cxx11::string::~string((string *)local_150);
  return;
}

Assistant:

void NativeColorMappingCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const int width		= 128;
	const int height	= 128;

	const tcu::Vec4 colors[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),

		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f)
	};

	const Library&						egl				= m_eglTestCtx.getLibrary();
	const string						configIdStr		(de::toString(eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID)));
	tcu::ScopedLogSection				logSection		(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames		= 5;
	const eglu::NativeWindowFactory*	windowFactory;
	const eglu::NativePixmapFactory*	pixmapFactory;

	logConfigInfo(m_testCtx.getLog(), egl, display, config, m_nativeType, waitFrames);

	try
	{
		windowFactory = &eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if ((windowFactory->getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
			TCU_THROW(NotSupportedError, "Native window doesn't support readPixels()");
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_WINDOW)
			throw;
		else
			windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if (m_nativeType == NATIVETYPE_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels()");
		}
		else if (m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0 ||
				(pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels() or legacy create surface");
		}
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_PIXMAP || m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
			throw;
		else
			pixmapFactory = DE_NULL;
	}

	DE_ASSERT(m_nativeType != NATIVETYPE_WINDOW || windowFactory);
	DE_ASSERT((m_nativeType != NATIVETYPE_PIXMAP && m_nativeType != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) || pixmapFactory);

	eglu::UniqueContext		context		(egl, display, createGLES2Context(egl, display, config));
	glw::Functions			gl;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	switch (m_nativeType)
	{
		case NATIVETYPE_WINDOW:
		{
			de::UniquePtr<eglu::NativeWindow>	nativeWindow	(windowFactory->createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::WindowParams::VISIBILITY_VISIBLE)));

			if (!testNativeWindow(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativeWindow, display, *context, config, gl, m_render, waitFrames, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmap(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		case NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmapCopy(m_testCtx.getLog(), egl, *nativePixmap, display, *context, config, gl, m_render, DE_LENGTH_OF_ARRAY(colors), colors))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}